

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

void LogLuv24toXYZ(uint32_t p,float *XYZ)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar5;
  double dVar6;
  double v;
  double u;
  double local_38;
  double local_30;
  undefined1 local_28 [16];
  
  uVar1 = p >> 0xe & 0x3ff;
  if ((uVar1 == 0) ||
     (dVar6 = exp(((double)uVar1 + 0.5) * 0.010830424696249145 + -8.317766166719343), dVar6 <= 0.0))
  {
    XYZ[2] = 0.0;
    XYZ[0] = 0.0;
    XYZ[1] = 0.0;
  }
  else {
    local_28._8_4_ = extraout_XMM0_Dc;
    local_28._0_8_ = dVar6;
    local_28._12_4_ = extraout_XMM0_Dd;
    iVar2 = uv_decode(&local_30,&local_38,p & 0x3fff);
    if (iVar2 < 0) {
      uVar3 = 0x94b8199e;
      uVar4 = 0x3fde50d7;
      local_30 = 0.210526316;
    }
    else {
      uVar3 = SUB84(local_38,0);
      uVar4 = (undefined4)((ulong)local_38 >> 0x20);
    }
    dVar6 = 1.0 / (local_30 * 6.0 + (double)CONCAT44(uVar4,uVar3) * -16.0 + 12.0);
    dVar5 = local_30 * 9.0 * dVar6;
    dVar6 = (double)CONCAT44(uVar4,uVar3) * 4.0 * dVar6;
    *(ulong *)XYZ =
         CONCAT44((float)(double)local_28._0_8_,(float)((dVar5 / dVar6) * (double)local_28._0_8_));
    XYZ[2] = (float)((((1.0 - dVar5) - dVar6) / dVar6) * (double)local_28._0_8_);
  }
  return;
}

Assistant:

void
    LogLuv24toXYZ(uint32_t p, float *XYZ)
{
    int Ce;
    double L, u, v, s, x, y;
    /* decode luminance */
    L = LogL10toY(p >> 14 & 0x3ff);
    if (L <= 0.)
    {
        XYZ[0] = XYZ[1] = XYZ[2] = 0.;
        return;
    }
    /* decode color */
    Ce = p & 0x3fff;
    if (uv_decode(&u, &v, Ce) < 0)
    {
        u = U_NEU;
        v = V_NEU;
    }
    s = 1. / (6. * u - 16. * v + 12.);
    x = 9. * u * s;
    y = 4. * v * s;
    /* convert to XYZ */
    XYZ[0] = (float)(x / y * L);
    XYZ[1] = (float)L;
    XYZ[2] = (float)((1. - x - y) / y * L);
}